

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_contextual_end(nk_context *ctx)

{
  byte *pbVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  nk_window *pnVar5;
  nk_panel *pnVar6;
  nk_vec2 nVar7;
  byte bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  if ((ctx != (nk_context *)0x0) && (pnVar5 = ctx->current, pnVar5 != (nk_window *)0x0)) {
    pnVar6 = pnVar5->layout;
    if ((pnVar6->flags & 0x400) != 0) {
      fVar2 = pnVar6->at_y;
      fVar9 = (pnVar6->bounds).y + (pnVar6->bounds).h;
      fVar3 = 0.0;
      fVar10 = 0.0;
      fVar4 = 0.0;
      fVar11 = 0.0;
      if (fVar2 < fVar9) {
        nVar7 = nk_panel_get_padding(&ctx->style,pnVar6->type);
        fVar3 = (pnVar6->bounds).x;
        fVar4 = (pnVar6->bounds).w;
        fVar10 = nVar7.y + fVar2 + pnVar6->footer_height + pnVar6->border;
        fVar11 = fVar9 - fVar10;
      }
      if (((ctx->input).mouse.buttons[0].down == 0) ||
         (bVar8 = 1, (ctx->input).mouse.buttons[0].clicked == 0)) {
        bVar8 = 0;
      }
      fVar2 = (ctx->input).mouse.pos.x;
      if ((((fVar3 <= fVar2) && (fVar2 <= fVar3 + fVar4)) &&
          (fVar2 = (ctx->input).mouse.pos.y, fVar10 <= fVar2)) &&
         ((bool)(bVar8 & fVar2 <= fVar10 + fVar11))) {
        pbVar1 = (byte *)((long)&pnVar5->flags + 1);
        *pbVar1 = *pbVar1 | 0x10;
      }
    }
    if ((pnVar5->flags & 0x1000) != 0) {
      pnVar5->seq = 0;
    }
    nk_popup_end(ctx);
    return;
  }
  return;
}

Assistant:

NK_API void
nk_contextual_end(struct nk_context *ctx)
{
    struct nk_window *popup;
    struct nk_panel *panel;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current) return;

    popup = ctx->current;
    panel = popup->layout;
    NK_ASSERT(popup->parent);
    NK_ASSERT(panel->type & NK_PANEL_SET_POPUP);
    if (panel->flags & NK_WINDOW_DYNAMIC) {
        /* Close behavior
        This is a bit hack solution since we do not now before we end our popup
        how big it will be. We therefore do not directly now when a
        click outside the non-blocking popup must close it at that direct frame.
        Instead it will be closed in the next frame.*/
        struct nk_rect body = {0,0,0,0};
        if (panel->at_y < (panel->bounds.y + panel->bounds.h)) {
            struct nk_vec2 padding = nk_panel_get_padding(&ctx->style, panel->type);
            body = panel->bounds;
            body.y = (panel->at_y + panel->footer_height + panel->border + padding.y);
            body.h = (panel->bounds.y + panel->bounds.h) - body.y;
        }

        {int pressed = nk_input_is_mouse_pressed(&ctx->input, NK_BUTTON_LEFT);
        int in_body = nk_input_is_mouse_hovering_rect(&ctx->input, body);
        if (pressed && in_body)
            popup->flags |= NK_WINDOW_HIDDEN;
        }
    }
    if (popup->flags & NK_WINDOW_HIDDEN)
        popup->seq = 0;
    nk_popup_end(ctx);
    return;
}